

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ecdsa_adaptor.cpp
# Opt level: O0

void __thiscall AdaptorSignature_Verify_Test::TestBody(AdaptorSignature_Verify_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_168;
  AssertHelper local_148;
  Message local_140;
  allocator local_131;
  string local_130;
  Pubkey local_110;
  allocator local_f1;
  string local_f0;
  Pubkey local_d0;
  allocator local_b1;
  string local_b0;
  ByteData256 local_90;
  bool local_71;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  AdaptorSignature adaptor_sig;
  AdaptorSignature_Verify_Test *this_local;
  
  adaptor_sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,
             "03424d14a5471c048ab87b3b83f6085d125d5864249ae4297a57c84e74710bb6730223f325042fce535d040fee52ec13231bf709ccd84233c6944b90317e62528b2527dff9d659a96db4c99f9750168308633c1867b70f3a18fb0f4539a1aecedcd1fc0148fc22f36b6303083ece3f872b18e35d368b3958efe5fb081f7716736ccb598d269aa3084d57e1855e1ea9a45efc10463bbf32ae378029f5763ceb40173f"
             ,&local_49);
  cfd::core::AdaptorSignature::AdaptorSignature((AdaptorSignature *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b0,"8131e6f4b45754f2c90bd06688ceeabc0c45055460729928b4eecf11026a9e2d",
             &local_b1);
  cfd::core::ByteData256::ByteData256(&local_90,&local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_f0,
             "035be5e9478209674a96e60f1f037f6176540fd001fa1d64694770c56a7709c42c",&local_f1);
  cfd::core::Pubkey::Pubkey(&local_d0,&local_f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_130,
             "02c2662c97488b07b6e819124b8989849206334a4c2fbdf691f7b34d2b16e9c293",&local_131);
  cfd::core::Pubkey::Pubkey(&local_110,&local_130);
  local_71 = cfd::core::AdaptorSignature::Verify
                       ((AdaptorSignature *)local_28,&local_90,&local_d0,&local_110);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_70,&local_71,(type *)0x0)
  ;
  cfd::core::Pubkey::~Pubkey(&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  cfd::core::Pubkey::~Pubkey(&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  cfd::core::ByteData256::~ByteData256(&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_168,(internal *)local_70,
               (AssertionResult *)
               "adaptor_sig.Verify( ByteData256(\"8131e6f4b45754f2c90bd06688ceeabc0c45055460729928b4eecf11026a9e2d\"), Pubkey(\"035be5e9478209674a96e60f1f037f6176540fd001fa1d64694770c56a7709c42c\"), Pubkey(\"02c2662c97488b07b6e819124b8989849206334a4c2fbdf691f7b34d2b16e9c293\"))"
               ,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_ecdsa_adaptor.cpp"
               ,0x2c,message);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  cfd::core::AdaptorSignature::~AdaptorSignature((AdaptorSignature *)local_28);
  return;
}

Assistant:

TEST(AdaptorSignature, Verify) {
  AdaptorSignature adaptor_sig("03424d14a5471c048ab87b3b83f6085d125d5864249ae4297a57c84e74710bb6730223f325042fce535d040fee52ec13231bf709ccd84233c6944b90317e62528b2527dff9d659a96db4c99f9750168308633c1867b70f3a18fb0f4539a1aecedcd1fc0148fc22f36b6303083ece3f872b18e35d368b3958efe5fb081f7716736ccb598d269aa3084d57e1855e1ea9a45efc10463bbf32ae378029f5763ceb40173f");  // NOLINT

  EXPECT_TRUE(
      adaptor_sig.Verify(
          ByteData256("8131e6f4b45754f2c90bd06688ceeabc0c45055460729928b4eecf11026a9e2d"),  // NOLINT
          Pubkey("035be5e9478209674a96e60f1f037f6176540fd001fa1d64694770c56a7709c42c"),  // NOLINT
          Pubkey("02c2662c97488b07b6e819124b8989849206334a4c2fbdf691f7b34d2b16e9c293")));  // NOLINT
}